

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O0

void __thiscall
leveldb::(anonymous_namespace)::Repairer::ConvertLogToTable(unsigned_long)::LogReporter::
Corruption(unsigned_long,leveldb::Status_const__(void *this,size_t bytes,Status *s)

{
  Logger *info_log;
  undefined8 uVar1;
  undefined8 uVar2;
  string local_40;
  Status *local_20;
  Status *s_local;
  size_t bytes_local;
  LogReporter *this_local;
  
  info_log = *(Logger **)((long)this + 0x10);
  uVar1 = *(undefined8 *)((long)this + 0x18);
  local_20 = s;
  s_local = (Status *)bytes;
  bytes_local = (size_t)this;
  Status::ToString_abi_cxx11_(&local_40,s);
  uVar2 = std::__cxx11::string::c_str();
  Log(info_log,"Log #%llu: dropping %d bytes; %s",uVar1,bytes & 0xffffffff,uVar2);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& s) override {
        // We print error messages for corruption, but continue repairing.
        Log(info_log, "Log #%llu: dropping %d bytes; %s",
            (unsigned long long)lognum, static_cast<int>(bytes),
            s.ToString().c_str());
      }